

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O2

btBroadphasePair * __thiscall
btSortedOverlappingPairCache::findPair
          (btSortedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  bool bVar1;
  int iVar2;
  btBroadphasePair *pbVar3;
  btBroadphasePair tmpPair;
  btBroadphasePair local_38;
  
  bVar1 = needsBroadphaseCollision(this,proxy0,proxy1);
  if (bVar1) {
    local_38.m_pProxy1 = proxy0;
    if (proxy0->m_uniqueId < proxy1->m_uniqueId) {
      local_38.m_pProxy1 = proxy1;
      proxy1 = proxy0;
    }
    local_38.m_algorithm = (btCollisionAlgorithm *)0x0;
    local_38.field_3.m_internalInfo1 = (void *)0x0;
    local_38.m_pProxy0 = proxy1;
    iVar2 = btAlignedObjectArray<btBroadphasePair>::findLinearSearch
                      (&this->m_overlappingPairArray,&local_38);
    pbVar3 = (btBroadphasePair *)0x0;
    if (iVar2 < (this->m_overlappingPairArray).m_size) {
      pbVar3 = (this->m_overlappingPairArray).m_data + iVar2;
    }
  }
  else {
    pbVar3 = (btBroadphasePair *)0x0;
  }
  return pbVar3;
}

Assistant:

btBroadphasePair*	btSortedOverlappingPairCache::findPair(btBroadphaseProxy* proxy0,btBroadphaseProxy* proxy1)
{
	if (!needsBroadphaseCollision(proxy0,proxy1))
		return 0;

	btBroadphasePair tmpPair(*proxy0,*proxy1);
	int findIndex = m_overlappingPairArray.findLinearSearch(tmpPair);

	if (findIndex < m_overlappingPairArray.size())
	{
		//btAssert(it != m_overlappingPairSet.end());
		 btBroadphasePair* pair = &m_overlappingPairArray[findIndex];
		return pair;
	}
	return 0;
}